

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonSetFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  uint in_ESI;
  sqlite3_context *in_RDI;
  sqlite3_value **unaff_retaddr;
  int bIsSet;
  int flags;
  char *in_stack_ffffffffffffffd8;
  
  pvVar1 = sqlite3_user_data(in_RDI);
  if (0 < (int)in_ESI) {
    if ((in_ESI & 1) == 0) {
      jsonWrongNumArgs((sqlite3_context *)CONCAT44((int)pvVar1,(uint)(((ulong)pvVar1 & 4) != 0)),
                       in_stack_ffffffffffffffd8);
    }
    else {
      jsonInsertIntoBlob((sqlite3_context *)argv,flags,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

static void jsonSetFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){

  int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  int bIsSet = (flags&JSON_ISSET)!=0;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, bIsSet ? "set" : "insert");
    return;
  }
  jsonInsertIntoBlob(ctx, argc, argv, bIsSet ? JEDIT_SET : JEDIT_INS);
}